

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS0.cpp
# Opt level: O3

bool __thiscall RTIMULSM9DS0::IMURead(RTIMULSM9DS0 *this)

{
  bool bVar1;
  uint64_t uVar2;
  uchar status;
  uchar compassData [6];
  uchar accelData [6];
  uchar gyroData [6];
  byte local_1b;
  uchar local_1a [6];
  uchar local_14 [6];
  uchar local_e [6];
  
  bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_gyroSlaveAddr,
                            '\'','\x01',&local_1b,"Failed to read LSM9DS0 status");
  if (((bVar1) && ((local_1b & 8) != 0)) &&
     (bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                this->m_gyroSlaveAddr,0xa8,'\x06',local_e,
                                "Failed to read LSM9DS0 gyro data"), bVar1)) {
    uVar2 = RTMath::currentUSecsSinceEpoch();
    (this->super_RTIMU).m_imuData.timestamp = uVar2;
    bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                              this->m_accelCompassSlaveAddr,0xa8,'\x06',local_14,
                              "Failed to read LSM9DS0 accel data");
    if ((bVar1) &&
       (bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                  this->m_accelCompassSlaveAddr,0x88,'\x06',local_1a,
                                  "Failed to read LSM9DS0 compass data"), bVar1)) {
      RTMath::convertToVector(local_e,&(this->super_RTIMU).m_imuData.gyro,this->m_gyroScale,false);
      RTMath::convertToVector
                (local_14,&(this->super_RTIMU).m_imuData.accel,this->m_accelScale,false);
      RTMath::convertToVector
                (local_1a,&(this->super_RTIMU).m_imuData.compass,this->m_compassScale,false);
      *(ulong *)((this->super_RTIMU).m_imuData.gyro.m_data + 1) =
           *(ulong *)((this->super_RTIMU).m_imuData.gyro.m_data + 1) ^ 0x8000000080000000;
      (this->super_RTIMU).m_imuData.accel.m_data[0] = -(this->super_RTIMU).m_imuData.accel.m_data[0]
      ;
      (this->super_RTIMU).m_imuData.compass.m_data[1] =
           -(this->super_RTIMU).m_imuData.compass.m_data[1];
      RTIMU::handleGyroBias(&this->super_RTIMU);
      RTIMU::calibrateAverageCompass(&this->super_RTIMU);
      RTIMU::calibrateAccel(&this->super_RTIMU);
      RTIMU::updateFusion(&this->super_RTIMU);
      return true;
    }
  }
  return false;
}

Assistant:

bool RTIMULSM9DS0::IMURead()
{
    unsigned char status;
    unsigned char gyroData[6];
    unsigned char accelData[6];
    unsigned char compassData[6];


#ifdef LSM9DS0_CACHE_MODE
    int count;

    if (!m_settings->HALRead(m_gyroSlaveAddr, LSM9DS0_GYRO_FIFO_SRC, 1, &status, "Failed to read LSM9DS0 gyro fifo status"))
        return false;

    if ((status & 0x40) != 0) {
        HAL_INFO("LSM9DS0 gyro fifo overrun\n");
        if (!m_settings->HALWrite(m_gyroSlaveAddr, LSM9DS0_GYRO_CTRL5, 0x10, "Failed to set LSM9DS0 gyro CTRL5"))
            return false;

        if (!m_settings->HALWrite(m_gyroSlaveAddr, LSM9DS0_GYRO_FIFO_CTRL, 0x0, "Failed to set LSM9DS0 gyro FIFO mode"))
            return false;

        if (!m_settings->HALWrite(m_gyroSlaveAddr, LSM9DS0_GYRO_FIFO_CTRL, 0x3f, "Failed to set LSM9DS0 gyro FIFO mode"))
            return false;

        if (!setGyroCTRL5())
            return false;

        m_imuData.timestamp += m_sampleInterval * 32;
        return false;
    }

    // get count of samples in fifo
    count = status & 0x1f;

    if ((m_cacheCount == 0) && (count > 0) && (count < LSM9DS0_FIFO_THRESH)) {
        // special case of a small fifo and nothing cached - just handle as simple read

        if (!m_settings->HALRead(m_gyroSlaveAddr, 0x80 | LSM9DS0_GYRO_OUT_X_L, 6, gyroData, "Failed to read LSM9DS0 gyro data"))
            return false;

        if (!m_settings->HALRead(m_accelCompassSlaveAddr, 0x80 | LSM9DS0_OUT_X_L_A, 6, accelData, "Failed to read LSM9DS0 accel data"))
            return false;

        if (!m_settings->HALRead(m_accelCompassSlaveAddr, 0x80 | LSM9DS0_OUT_X_L_M, 6, compassData, "Failed to read LSM9DS0 compass data"))
            return false;

        if (m_firstTime)
            m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();
        else
            m_imuData.timestamp += m_sampleInterval;

        m_firstTime = false;
   } else {
        if (count >=  LSM9DS0_FIFO_THRESH) {
            // need to create a cache block

            if (m_cacheCount == LSM9DS0_CACHE_BLOCK_COUNT) {
                // all cache blocks are full - discard oldest and update timestamp to account for lost samples
                m_imuData.timestamp += m_sampleInterval * m_cache[m_cacheOut].count;
                if (++m_cacheOut == LSM9DS0_CACHE_BLOCK_COUNT)
                    m_cacheOut = 0;
                m_cacheCount--;
            }

            if (!m_settings->HALRead(m_gyroSlaveAddr, 0x80 | LSM9DS0_GYRO_OUT_X_L, LSM9DS0_FIFO_CHUNK_SIZE * LSM9DS0_FIFO_THRESH,
                         m_cache[m_cacheIn].data, "Failed to read LSM9DS0 fifo data"))
                return false;

            if (!m_settings->HALRead(m_accelCompassSlaveAddr, 0x80 | LSM9DS0_OUT_X_L_A, 6,
                         m_cache[m_cacheIn].accel, "Failed to read LSM9DS0 accel data"))
                return false;

            if (!m_settings->HALRead(m_accelCompassSlaveAddr, 0x80 | LSM9DS0_OUT_X_L_M, 6,
                         m_cache[m_cacheIn].compass, "Failed to read LSM9DS0 compass data"))
                return false;

            m_cache[m_cacheIn].count = LSM9DS0_FIFO_THRESH;
            m_cache[m_cacheIn].index = 0;

            m_cacheCount++;
            if (++m_cacheIn == LSM9DS0_CACHE_BLOCK_COUNT)
                m_cacheIn = 0;

        }

        //  now fifo has been read if necessary, get something to process

        if (m_cacheCount == 0)
            return false;

        memcpy(gyroData, m_cache[m_cacheOut].data + m_cache[m_cacheOut].index, LSM9DS0_FIFO_CHUNK_SIZE);
        memcpy(accelData, m_cache[m_cacheOut].accel, 6);
        memcpy(compassData, m_cache[m_cacheOut].compass, 6);

        m_cache[m_cacheOut].index += LSM9DS0_FIFO_CHUNK_SIZE;

        if (--m_cache[m_cacheOut].count == 0) {
            //  this cache block is now empty

            if (++m_cacheOut == LSM9DS0_CACHE_BLOCK_COUNT)
                m_cacheOut = 0;
            m_cacheCount--;
        }
        if (m_firstTime)
            m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();
        else
            m_imuData.timestamp += m_sampleInterval;

        m_firstTime = false;
    }

#else
    if (!m_settings->HALRead(m_gyroSlaveAddr, LSM9DS0_GYRO_STATUS, 1, &status, "Failed to read LSM9DS0 status"))
        return false;

    if ((status & 0x8) == 0)
        return false;

    if (!m_settings->HALRead(m_gyroSlaveAddr, 0x80 | LSM9DS0_GYRO_OUT_X_L, 6, gyroData, "Failed to read LSM9DS0 gyro data"))
        return false;

    m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();

    if (!m_settings->HALRead(m_accelCompassSlaveAddr, 0x80 | LSM9DS0_OUT_X_L_A, 6, accelData, "Failed to read LSM9DS0 accel data"))
        return false;

    if (!m_settings->HALRead(m_accelCompassSlaveAddr, 0x80 | LSM9DS0_OUT_X_L_M, 6, compassData, "Failed to read LSM9DS0 compass data"))
        return false;

#endif

    RTMath::convertToVector(gyroData, m_imuData.gyro, m_gyroScale, false);
    RTMath::convertToVector(accelData, m_imuData.accel, m_accelScale, false);
    RTMath::convertToVector(compassData, m_imuData.compass, m_compassScale, false);

    //  sort out gyro axes and correct for bias

    m_imuData.gyro.setX(m_imuData.gyro.x());
    m_imuData.gyro.setY(-m_imuData.gyro.y());
    m_imuData.gyro.setZ(-m_imuData.gyro.z());

    //  sort out accel data;

    m_imuData.accel.setX(-m_imuData.accel.x());

    //  sort out compass axes

    m_imuData.compass.setY(-m_imuData.compass.y());

    //  now do standard processing

    handleGyroBias();
    calibrateAverageCompass();
    calibrateAccel();

    //  now update the filter

    updateFusion();

    return true;
}